

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O0

void __thiscall
TPZStepSolver<std::complex<float>_>::ResetSolver(TPZStepSolver<std::complex<float>_> *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 0xac) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  if ((*(long *)(in_RDI + 0xd8) != 0) && (*(long **)(in_RDI + 0xd8) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0xd8) + 8))();
  }
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  return;
}

Assistant:

void TPZStepSolver<TVar>::ResetSolver() {
	fSolver = this->ENoSolver;
	fDecompose  = ENoDecompose;
	fMaxIterations = 0;
    fNumIterations = -1;
	fTol = 0.;
	fNumVectors = 0;
	fOverRelax = 0.;
	if(fPrecond) delete fPrecond;
	fPrecond = 0;
	fFromCurrent = 0;
}